

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_assignment_no_alias<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,1,true>,_1,1,false>,_1,1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>>,Eigen::internal::assign_op<float,float>>
               (Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>
                *dst,CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                     *src,assign_op<float,_float> *func)

{
  ActualDstType actualDst;
  assign_op<float,_float> *func_local;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  *src_local;
  Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>
  *dst_local;
  
  Assignment<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_true>,_-1,_1,_false>,_-1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
  ::run(dst,src,func);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
  enum {
    NeedToTranspose = (    (int(Dst::RowsAtCompileTime) == 1 && int(Src::ColsAtCompileTime) == 1)
                        || (int(Dst::ColsAtCompileTime) == 1 && int(Src::RowsAtCompileTime) == 1)
                      ) && int(Dst::SizeAtCompileTime) != 1
  };

  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst>::type ActualDstTypeCleaned;
  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst&>::type ActualDstType;
  ActualDstType actualDst(dst);

  // TODO check whether this is the right place to perform these checks:
  EIGEN_STATIC_ASSERT_LVALUE(Dst)
  EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(ActualDstTypeCleaned,Src)
  EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename ActualDstTypeCleaned::Scalar,typename Src::Scalar);

  Assignment<ActualDstTypeCleaned,Src,Func>::run(actualDst, src, func);
}